

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O3

_Bool ransac(Correspondence *matched_points,int npoints,TransformationType type,
            MotionModel *motion_models,int num_desired_motions,_Bool *mem_alloc_failed)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  Correspondence *pCVar4;
  MotionModel *pMVar5;
  _Bool _Var6;
  int *__base;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  void *pvVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  int *piVar17;
  long lVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int indices [4];
  double params_this_motion [6];
  RANSAC_MOTION local_f8;
  ulong local_e0;
  void *local_d8;
  ulong local_d0;
  RansacModelInfo *local_c8;
  undefined4 local_c0;
  uint local_bc;
  undefined1 local_b8 [16];
  size_t local_a8;
  FindTransformationFunc local_a0;
  Correspondence *local_98;
  double dStack_90;
  int local_88 [4];
  MotionModel *local_78;
  ulong local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  uVar7 = (ulong)(uint)num_desired_motions;
  uVar10 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  uVar2 = ransac_model_info[uVar10].minpts;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  if (0 < num_desired_motions) {
    lVar13 = 0;
    do {
      pdVar1 = (double *)((long)motion_models->params + lVar13 + 0x20);
      *pdVar1 = 0.0;
      pdVar1[1] = 1.0;
      pdVar1 = (double *)((long)motion_models->params + lVar13 + 0x10);
      *pdVar1 = 1.0;
      pdVar1[1] = 0.0;
      pdVar1 = (double *)((long)motion_models->params + lVar13);
      *pdVar1 = 0.0;
      pdVar1[1] = 0.0;
      *(undefined4 *)((long)motion_models->params + lVar13 + 0x38) = 0;
      lVar13 = lVar13 + 0x40;
    } while (uVar7 << 6 != lVar13);
  }
  local_c0 = 0;
  if ((npoints == 0) || (local_c0 = 0, npoints < (int)(uVar2 * 5))) goto LAB_002aa805;
  local_bc = (int)((double)npoints * 0.1);
  if ((int)((double)npoints * 0.1) < (int)uVar2) {
    local_bc = uVar2;
  }
  local_a8 = (size_t)num_desired_motions;
  local_98 = matched_points;
  local_78 = motion_models;
  __base = (int *)aom_calloc(local_a8,0x18);
  local_d8 = aom_malloc((long)(num_desired_motions + 1) * (long)npoints * 4);
  pCVar4 = local_98;
  local_c0 = (undefined4)
             CONCAT71((int7)((ulong)motion_models >> 8),
                      local_d8 != (void *)0x0 && __base != (int *)0x0);
  if (local_d8 != (void *)0x0 && __base != (int *)0x0) {
    local_c8 = ransac_model_info + uVar10;
    if (0 < num_desired_motions) {
      lVar13 = 0;
      pvVar11 = local_d8;
      do {
        *(void **)((long)__base + lVar13 + 0x10) = pvVar11;
        lVar13 = lVar13 + 0x18;
        pvVar11 = (void *)((long)pvVar11 + (long)npoints * 4);
      } while (uVar7 * 0x18 != lVar13);
    }
    local_f8.num_inliers = 0;
    local_f8._4_4_ = 0;
    local_f8.sse = 0.0;
    local_f8.inlier_indices = (int *)((long)local_d8 + (long)(num_desired_motions * npoints) * 4);
    local_a0 = local_c8->find_transformation;
    uVar10 = 0;
    uVar15 = (ulong)(uint)npoints;
    piVar16 = __base;
    local_e0 = uVar7;
    local_d0 = uVar7;
LAB_002aa4a2:
    local_70 = uVar10;
    do {
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          uVar15 = (ulong)((int)uVar15 * 0x41c64e6d + 0x3039);
          lVar13 = uVar15 * (uint)npoints;
          iVar9 = (int)((ulong)lVar13 >> 0x20);
          if (uVar7 != 0) {
            do {
              iVar9 = (int)((ulong)lVar13 >> 0x20);
              uVar14 = 0;
              while (local_88[uVar14] != iVar9) {
                uVar14 = uVar14 + 1;
                if (uVar7 == uVar14) goto LAB_002aa501;
              }
              uVar15 = (ulong)((int)uVar15 * 0x41c64e6d + 0x3039);
              lVar13 = uVar15 * (uint)npoints;
            } while( true );
          }
LAB_002aa501:
          local_88[uVar7] = iVar9;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      _Var6 = (*local_a0)(pCVar4,local_88,uVar2,&local_68);
      if (!_Var6) {
        iVar9 = (int)local_d0;
        iVar12 = (int)uVar10;
        goto LAB_002aa62c;
      }
      local_b8._0_4_ = (int)uVar10;
      (*local_c8->score_model)(&local_68,pCVar4,npoints,&local_f8);
      iVar9 = (int)local_d0;
      iVar12 = local_b8._0_4_;
      if ((local_f8.num_inliers < (int)local_bc) ||
         ((local_f8.num_inliers <= *piVar16 &&
          ((local_f8.num_inliers < *piVar16 || (*(double *)(piVar16 + 2) <= local_f8.sse))))))
      goto LAB_002aa62c;
      *piVar16 = local_f8.num_inliers;
      *(double *)(piVar16 + 2) = local_f8.sse;
      piVar17 = *(int **)(piVar16 + 4);
      *(int **)(piVar16 + 4) = local_f8.inlier_indices;
      piVar8 = __base;
      uVar10 = local_e0;
      local_f8.inlier_indices = piVar17;
      if (0 < iVar9) goto LAB_002aa5f8;
      uVar10 = (ulong)(local_b8._0_4_ + 1);
      if (local_b8._0_4_ + 1 == 0x14) {
        qsort(__base,local_a8,0x18,compare_motions);
        goto LAB_002aa7ef;
      }
    } while( true );
  }
  *mem_alloc_failed = true;
  goto LAB_002aa7ef;
LAB_002aa5f8:
  do {
    piVar17 = piVar8;
    if ((*piVar16 <= *piVar8) &&
       ((*piVar16 < *piVar8 ||
        (*(double *)(piVar8 + 2) < *(double *)(piVar16 + 2) ||
         *(double *)(piVar8 + 2) == *(double *)(piVar16 + 2))))) {
      piVar17 = piVar16;
    }
    uVar10 = uVar10 - 1;
    piVar8 = piVar8 + 6;
    piVar16 = piVar17;
  } while (uVar10 != 0);
  iVar12 = (int)local_70;
LAB_002aa62c:
  uVar10 = (ulong)(iVar12 + 1U);
  if (iVar12 + 1U == 0x14) goto code_r0x002aa63c;
  goto LAB_002aa4a2;
code_r0x002aa63c:
  qsort(__base,local_a8,0x18,compare_motions);
  pCVar4 = local_98;
  if (0 < iVar9) {
    uVar10 = 0;
    do {
      if (0 < __base[uVar10 * 6]) {
        piVar16 = __base + uVar10 * 6;
        iVar12 = 5;
        iVar9 = __base[uVar10 * 6];
        do {
          _Var6 = (*local_a0)(pCVar4,*(int **)(piVar16 + 4),iVar9,&local_68);
          if (!_Var6) goto LAB_002aa7b0;
          (*local_c8->score_model)(&local_68,pCVar4,npoints,&local_f8);
          pMVar5 = local_78;
          if (local_f8.num_inliers <= *piVar16) break;
          *piVar16 = local_f8.num_inliers;
          *(double *)(piVar16 + 2) = local_f8.sse;
          piVar17 = *(int **)(piVar16 + 4);
          *(int **)(piVar16 + 4) = local_f8.inlier_indices;
          iVar12 = iVar12 + -1;
          iVar9 = local_f8.num_inliers;
          local_f8.inlier_indices = piVar17;
        } while (iVar12 != 0);
        local_78[uVar10].params[4] = local_48;
        (local_78[uVar10].params + 4)[1] = dStack_40;
        local_78[uVar10].params[2] = local_58;
        (local_78[uVar10].params + 2)[1] = dStack_50;
        local_78[uVar10].params[0] = local_68;
        local_78[uVar10].params[1] = dStack_60;
        iVar9 = *piVar16;
        if (0 < iVar9) {
          lVar13 = *(long *)(piVar16 + 4);
          piVar17 = local_78[uVar10].inliers;
          lVar18 = 0;
          do {
            local_98 = (Correspondence *)pCVar4[*(int *)(lVar13 + lVar18 * 4)].x;
            dStack_90 = pCVar4[*(int *)(lVar13 + lVar18 * 4)].y;
            dVar3 = rint((double)local_98);
            local_b8._8_4_ = extraout_XMM0_Dc;
            local_b8._0_8_ = dVar3;
            local_b8._12_4_ = extraout_XMM0_Dd;
            dVar3 = rint(dStack_90);
            *(ulong *)(piVar17 + lVar18 * 2) = CONCAT44((int)dVar3,(int)(double)local_b8._0_8_);
            lVar18 = lVar18 + 1;
            iVar9 = *piVar16;
          } while (lVar18 < iVar9);
        }
        pMVar5[uVar10].num_inliers = iVar9;
      }
LAB_002aa7b0:
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_e0);
  }
LAB_002aa7ef:
  aom_free(local_d8);
  aom_free(__base);
LAB_002aa805:
  return SUB41(local_c0,0);
}

Assistant:

bool ransac(const Correspondence *matched_points, int npoints,
            TransformationType type, MotionModel *motion_models,
            int num_desired_motions, bool *mem_alloc_failed) {
#if ALLOW_TRANSLATION_MODELS
  assert(type > IDENTITY && type < TRANS_TYPES);
#else
  assert(type > TRANSLATION && type < TRANS_TYPES);
#endif  // ALLOW_TRANSLATION_MODELS

  return ransac_internal(matched_points, npoints, motion_models,
                         num_desired_motions, &ransac_model_info[type],
                         mem_alloc_failed);
}